

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O0

void __thiscall
QList<QShaderDescription::PushConstantBlock>::resize_internal
          (QList<QShaderDescription::PushConstantBlock> *this,qsizetype newSize)

{
  bool bVar1;
  qsizetype qVar2;
  QGenericArrayOps<QShaderDescription::PushConstantBlock> *this_00;
  __off_t __length;
  QArrayDataPointer<QShaderDescription::PushConstantBlock> *in_RSI;
  QArrayDataPointer<QShaderDescription::PushConstantBlock> *in_RDI;
  QArrayDataPointer<QShaderDescription::PushConstantBlock> *in_stack_ffffffffffffffd0;
  QArrayDataPointer<QShaderDescription::PushConstantBlock> *this_01;
  QArrayDataPointer<QShaderDescription::PushConstantBlock> *in_stack_ffffffffffffffd8;
  QArrayDataPointer<QShaderDescription::PushConstantBlock> *in_stack_ffffffffffffffe0;
  QArrayDataPointer<QShaderDescription::PushConstantBlock> *__file;
  
  QArrayDataPointer<QShaderDescription::PushConstantBlock>::operator->(in_RDI);
  bVar1 = QArrayDataPointer<QShaderDescription::PushConstantBlock>::needsDetach
                    (in_stack_ffffffffffffffd0);
  this_01 = in_RSI;
  if (!bVar1) {
    in_stack_ffffffffffffffd8 =
         (QArrayDataPointer<QShaderDescription::PushConstantBlock> *)
         capacity((QList<QShaderDescription::PushConstantBlock> *)0x6f09e1);
    qVar2 = QArrayDataPointer<QShaderDescription::PushConstantBlock>::freeSpaceAtBegin
                      (in_stack_ffffffffffffffd8);
    in_stack_ffffffffffffffe0 = in_RSI;
    if ((long)in_RSI <= (long)in_stack_ffffffffffffffd8 - qVar2) {
      __file = this_01;
      qVar2 = size((QList<QShaderDescription::PushConstantBlock> *)in_RDI);
      if (qVar2 <= (long)this_01) {
        return;
      }
      this_00 = (QGenericArrayOps<QShaderDescription::PushConstantBlock> *)
                QArrayDataPointer<QShaderDescription::PushConstantBlock>::operator->(in_RDI);
      QtPrivate::QGenericArrayOps<QShaderDescription::PushConstantBlock>::truncate
                (this_00,(char *)__file,__length);
      return;
    }
  }
  QArrayDataPointer<QShaderDescription::PushConstantBlock>::detachAndGrow
            (this_01,(GrowthPosition)((ulong)in_RDI >> 0x20),(qsizetype)in_stack_ffffffffffffffe0,
             (PushConstantBlock **)in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0);
  return;
}

Assistant:

inline void QList<T>::resize_internal(qsizetype newSize)
{
    Q_ASSERT(newSize >= 0);

    if (d->needsDetach() || newSize > capacity() - d.freeSpaceAtBegin()) {
        d.detachAndGrow(QArrayData::GrowsAtEnd, newSize - d.size, nullptr, nullptr);
    } else if (newSize < size()) {
        d->truncate(newSize);
    }
}